

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O3

uint32_t FAudioFXReverb_LockForProcess
                   (FAudioFXReverb *fapo,uint32_t InputLockedParameterCount,
                   FAPOLockForProcessBufferParameters *pInputLockedParameters,
                   uint32_t OutputLockedParameterCount,
                   FAPOLockForProcessBufferParameters *pOutputLockedParameters)

{
  size_t sVar1;
  ushort uVar2;
  FAudioMallocFunc p_Var3;
  DspReverbChannel *pDVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  uint uVar8;
  FAudio_ChannelPositionFlags FVar9;
  uint32_t uVar10;
  float *pfVar11;
  FAudioWaveFormatEx *pFVar12;
  DspCombShelving *pDVar13;
  ushort uVar14;
  DspCombShelving *pDVar15;
  DspAllPass *pDVar16;
  long lVar17;
  FAudioWaveFormatEx *pFVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  undefined1 auVar31 [16];
  uint uVar32;
  undefined8 uVar33;
  undefined1 auVar34 [16];
  DspAllPass *local_a0;
  
  pFVar18 = pInputLockedParameters->pFormat;
  if (pFVar18->wFormatTag != 3) {
    if (pFVar18->wFormatTag != 0xfffe) {
      return 0x88970001;
    }
    iVar5 = SDL_memcmp((undefined1 *)((long)&pFVar18[1].nSamplesPerSec + 2),
                       IsFloatFormat_KSDATAFORMAT_SUBTYPE_IEEE_FLOAT,0x10);
    if (iVar5 != 0) {
      return 0x88970001;
    }
    pFVar18 = pInputLockedParameters->pFormat;
  }
  if (0xffff929e < pFVar18->nSamplesPerSec - 0xbb81) {
    uVar2 = pFVar18->nChannels;
    if (uVar2 == 6) {
      pFVar12 = pOutputLockedParameters->pFormat;
      uVar6 = 6;
      uVar14 = pFVar12->nChannels;
    }
    else if (uVar2 == 2) {
      pFVar12 = pOutputLockedParameters->pFormat;
      uVar6 = (uint)pFVar12->nChannels;
      uVar14 = pFVar12->nChannels | 4;
    }
    else {
      if (uVar2 != 1) {
        return 0x88970001;
      }
      pFVar12 = pOutputLockedParameters->pFormat;
      uVar14 = pFVar12->nChannels;
      uVar6 = (uint)uVar14;
      if (uVar14 == 1) goto LAB_0011697e;
    }
    if (uVar14 == 6) {
LAB_0011697e:
      fapo->inChannels = uVar2;
      fapo->outChannels = (uint16_t)uVar6;
      uVar10 = pFVar12->nSamplesPerSec;
      fapo->sampleRate = uVar10;
      fapo->inBlockAlign = pFVar18->nBlockAlign;
      fapo->outBlockAlign = pFVar12->nBlockAlign;
      p_Var3 = (fapo->base).pMalloc;
      SDL_memset(&fapo->reverb,0,0x17e0);
      fVar20 = (float)(int)uVar10;
      auVar25._0_4_ = fVar20 * 300.0;
      auVar25._4_4_ = fVar20 * 10.0;
      auVar25._8_4_ = fVar20 * 0.0;
      auVar25._12_4_ = fVar20 * 0.0;
      auVar26 = divps(auVar25,_DAT_00126960);
      (fapo->reverb).early_delay.sampleRate = uVar10;
      iVar5 = (int)auVar26._0_4_;
      iVar28 = (int)auVar26._4_4_;
      iVar29 = (int)auVar26._8_4_;
      iVar30 = (int)auVar26._12_4_;
      auVar31._0_4_ = iVar5 >> 0x1f;
      auVar31._4_4_ = iVar28 >> 0x1f;
      auVar31._8_4_ = iVar29 >> 0x1f;
      auVar31._12_4_ = iVar30 >> 0x1f;
      auVar34._0_4_ = (int)(auVar26._0_4_ - 2.1474836e+09);
      auVar34._4_4_ = (int)(auVar26._4_4_ - 2.1474836e+09);
      auVar34._8_4_ = (int)(auVar26._8_4_ - 2.1474836e+09);
      auVar34._12_4_ = (int)(auVar26._12_4_ - 2.1474836e+09);
      auVar26._4_4_ = iVar28;
      auVar26._0_4_ = iVar5;
      auVar26._8_4_ = iVar29;
      auVar26._12_4_ = iVar30;
      auVar26 = auVar34 & auVar31 | auVar26;
      uVar32 = auVar26._0_4_;
      uVar33 = auVar26._0_8_;
      (fapo->reverb).early_delay.capacity = (int)uVar33;
      (fapo->reverb).early_delay.delay = (int)((ulong)uVar33 >> 0x20);
      (fapo->reverb).early_delay.read_idx = 0;
      (fapo->reverb).early_delay.write_idx = auVar26._4_4_;
      sVar1 = (ulong)uVar32 * 4;
      pfVar11 = (float *)(*p_Var3)(sVar1);
      (fapo->reverb).early_delay.buffer = pfVar11;
      SDL_memset(pfVar11,0,(ulong)(fapo->reverb).early_delay.capacity << 2);
      (fapo->reverb).apf_in[0].delay.sampleRate = uVar10;
      (fapo->reverb).apf_in[0].delay.capacity = uVar32;
      uVar7 = (uint32_t)(long)((fVar20 * 13.28) / 1000.0);
      (fapo->reverb).apf_in[0].delay.delay = uVar7;
      (fapo->reverb).apf_in[0].delay.read_idx = 0;
      (fapo->reverb).apf_in[0].delay.write_idx = uVar7;
      pfVar11 = (float *)(*p_Var3)(sVar1);
      (fapo->reverb).apf_in[0].delay.buffer = pfVar11;
      SDL_memset(pfVar11,0,(ulong)(fapo->reverb).apf_in[0].delay.capacity << 2);
      (fapo->reverb).apf_in[0].feedback_gain = 0.5;
      uVar8 = uVar2 == 6 | 4;
      if ((uint16_t)uVar6 != 6) {
        uVar8 = uVar6;
      }
      (fapo->reverb).reverb_channels = uVar8;
      dVar22 = (double)((31415.928 / fVar20) * 0.5);
      pDVar13 = (fapo->reverb).channel[0].lpf_comb;
      local_a0 = (fapo->reverb).channel[0].apf_out;
      lVar17 = 0;
      do {
        (fapo->reverb).channel[lVar17].reverb_delay.sampleRate = uVar10;
        pDVar4 = (fapo->reverb).channel + lVar17;
        (pDVar4->reverb_delay).capacity = (int)uVar33;
        (pDVar4->reverb_delay).delay = (int)((ulong)uVar33 >> 0x20);
        (fapo->reverb).channel[lVar17].reverb_delay.read_idx = 0;
        (fapo->reverb).channel[lVar17].reverb_delay.write_idx = auVar26._4_4_;
        pfVar11 = (float *)(*p_Var3)(sVar1);
        (fapo->reverb).channel[lVar17].reverb_delay.buffer = pfVar11;
        SDL_memset(pfVar11,0,(ulong)(fapo->reverb).channel[lVar17].reverb_delay.capacity << 2);
        lVar19 = 0;
        pDVar15 = pDVar13;
        do {
          FVar9 = FAudio_GetChannelPositionFlags((fapo->reverb).reverb_channels,(int32_t)lVar17);
          fVar21 = 0.0;
          if ((FVar9 & Position_Right) != 0) {
            fVar21 = 0.5216;
          }
          fVar27 = *(float *)((long)COMB_DELAYS + lVar19);
          (pDVar15->comb_delay).sampleRate = uVar10;
          (pDVar15->comb_delay).capacity = uVar32;
          uVar7 = (uint32_t)(long)(((fVar21 + fVar27) * fVar20) / 1000.0);
          (pDVar15->comb_delay).delay = uVar7;
          (pDVar15->comb_delay).read_idx = 0;
          (pDVar15->comb_delay).write_idx = uVar7;
          pfVar11 = (float *)(*p_Var3)(sVar1);
          (pDVar15->comb_delay).buffer = pfVar11;
          SDL_memset(pfVar11,0,(ulong)(pDVar15->comb_delay).capacity << 2);
          dVar23 = (double)SDL_pow(0x4024000000000000,
                                   SUB84((double)(((float)(pDVar15->comb_delay).delay * -3.0 *
                                                  1000.0) /
                                                 ((float)(pDVar15->comb_delay).sampleRate * 500.0)),
                                         0));
          pDVar15->comb_feedback_gain = (float)dVar23;
          (pDVar15->low_shelving).sampleRate = uVar10;
          (pDVar15->low_shelving).delay0 = 0.0;
          (pDVar15->low_shelving).delay1 = 0.0;
          dVar23 = (double)SDL_pow(0x4024000000000000,0x40000000);
          dVar24 = (double)SDL_tan((double)((3141.5928 / fVar20) * 0.5));
          fVar21 = (float)dVar24 * (4.0 / ((float)dVar23 + 1.0));
          fVar27 = (1.0 - fVar21) / (fVar21 + 1.0);
          fVar21 = (1.0 - fVar27) * 0.5;
          (pDVar15->low_shelving).a0 = fVar21;
          (pDVar15->low_shelving).a1 = fVar21;
          (pDVar15->low_shelving).a2 = 0.0;
          (pDVar15->low_shelving).b1 = -fVar27;
          (pDVar15->low_shelving).b2 = 0.0;
          (pDVar15->low_shelving).c0 = (float)dVar23 + -1.0;
          (pDVar15->low_shelving).d0 = 1.0;
          (pDVar15->high_shelving).sampleRate = uVar10;
          (pDVar15->high_shelving).delay0 = 0.0;
          (pDVar15->high_shelving).delay1 = 0.0;
          dVar23 = (double)SDL_pow(0x4024000000000000,0x40000000);
          dVar24 = (double)SDL_tan(dVar22);
          fVar21 = (float)dVar24 * ((float)dVar23 + 1.0) * 0.25;
          fVar27 = (1.0 - fVar21) / (fVar21 + 1.0);
          fVar21 = (fVar27 + 1.0) * 0.5;
          (pDVar15->high_shelving).a0 = fVar21;
          (pDVar15->high_shelving).a1 = -fVar21;
          (pDVar15->high_shelving).a2 = 0.0;
          (pDVar15->high_shelving).b1 = -fVar27;
          (pDVar15->high_shelving).b2 = 0.0;
          (pDVar15->high_shelving).c0 = (float)dVar23 + -1.0;
          (pDVar15->high_shelving).d0 = 1.0;
          lVar19 = lVar19 + 4;
          pDVar15 = pDVar15 + 1;
        } while (lVar19 != 0x20);
        lVar19 = 0;
        pDVar16 = local_a0;
        do {
          FVar9 = FAudio_GetChannelPositionFlags((fapo->reverb).reverb_channels,(int32_t)lVar17);
          fVar21 = 0.0;
          if ((FVar9 & Position_Right) != 0) {
            fVar21 = 0.5216;
          }
          fVar27 = *(float *)((long)APF_OUT_DELAYS + lVar19);
          (pDVar16->delay).sampleRate = uVar10;
          (pDVar16->delay).capacity = uVar32;
          uVar7 = (uint32_t)(long)(((fVar21 + fVar27) * fVar20) / 1000.0);
          (pDVar16->delay).delay = uVar7;
          (pDVar16->delay).read_idx = 0;
          (pDVar16->delay).write_idx = uVar7;
          pfVar11 = (float *)(*p_Var3)(sVar1);
          (pDVar16->delay).buffer = pfVar11;
          SDL_memset(pfVar11,0,(ulong)(pDVar16->delay).capacity << 2);
          pDVar16->feedback_gain = 0.5;
          lVar19 = lVar19 + 4;
          pDVar16 = pDVar16 + 1;
        } while (lVar19 != 0x10);
        (fapo->reverb).channel[lVar17].room_high_shelf.sampleRate = uVar10;
        pDVar4 = (fapo->reverb).channel + lVar17;
        (pDVar4->room_high_shelf).delay0 = 0.0;
        (pDVar4->room_high_shelf).delay1 = 0.0;
        dVar23 = (double)SDL_pow(0x4024000000000000,0);
        dVar24 = (double)SDL_tan(dVar22);
        fVar21 = (float)dVar24 * ((float)dVar23 + 1.0) * 0.25;
        fVar27 = (1.0 - fVar21) / (fVar21 + 1.0);
        fVar21 = (fVar27 + 1.0) * 0.5;
        (fapo->reverb).channel[lVar17].room_high_shelf.a0 = fVar21;
        (fapo->reverb).channel[lVar17].room_high_shelf.a1 = -fVar21;
        (fapo->reverb).channel[lVar17].room_high_shelf.a2 = 0.0;
        (fapo->reverb).channel[lVar17].room_high_shelf.b1 = -fVar27;
        (fapo->reverb).channel[lVar17].room_high_shelf.b2 = 0.0;
        (fapo->reverb).channel[lVar17].room_high_shelf.c0 = (float)dVar23 + -1.0;
        (fapo->reverb).channel[lVar17].room_high_shelf.d0 = 1.0;
        (fapo->reverb).channel[lVar17].gain = 1.0;
        lVar17 = lVar17 + 1;
        pDVar13 = pDVar13 + 10;
        local_a0 = local_a0 + 0x1e;
      } while (lVar17 < (fapo->reverb).reverb_channels);
      (fapo->reverb).early_gain = 1.0;
      (fapo->reverb).reverb_gain = 1.0;
      (fapo->reverb).wet_ratio = 1.0;
      (fapo->reverb).dry_ratio = 0.0;
      (fapo->reverb).in_channels = (uint)uVar2;
      (fapo->reverb).out_channels = uVar6;
      uVar10 = FAPOBase_LockForProcess
                         (&fapo->base,InputLockedParameterCount,pInputLockedParameters,
                          OutputLockedParameterCount,pOutputLockedParameters);
      return uVar10;
    }
  }
  return 0x88970001;
}

Assistant:

uint32_t FAudioFXReverb_LockForProcess(
	FAudioFXReverb *fapo,
	uint32_t InputLockedParameterCount,
	const FAPOLockForProcessBufferParameters *pInputLockedParameters,
	uint32_t OutputLockedParameterCount,
	const FAPOLockForProcessBufferParameters *pOutputLockedParameters
) {
	/* Reverb specific validation */
	if (!IsFloatFormat(pInputLockedParameters->pFormat))
	{
		return FAPO_E_FORMAT_UNSUPPORTED;
	}

	if (	pInputLockedParameters->pFormat->nSamplesPerSec < FAUDIOFX_REVERB_MIN_FRAMERATE ||
		pInputLockedParameters->pFormat->nSamplesPerSec > FAUDIOFX_REVERB_MAX_FRAMERATE	)
	{
		return FAPO_E_FORMAT_UNSUPPORTED;
	}

	if (!(	(pInputLockedParameters->pFormat->nChannels == 1 &&
			(pOutputLockedParameters->pFormat->nChannels == 1 ||
			 pOutputLockedParameters->pFormat->nChannels == 6)) ||
		(pInputLockedParameters->pFormat->nChannels == 2 &&
			(pOutputLockedParameters->pFormat->nChannels == 2 ||
			 pOutputLockedParameters->pFormat->nChannels == 6)) ||
		(pInputLockedParameters->pFormat->nChannels == 6 &&
			pOutputLockedParameters->pFormat->nChannels == 6)))
	{
		return FAPO_E_FORMAT_UNSUPPORTED;
	}

	/* Save the things we care about */
	fapo->inChannels = pInputLockedParameters->pFormat->nChannels;
	fapo->outChannels = pOutputLockedParameters->pFormat->nChannels;
	fapo->sampleRate = pOutputLockedParameters->pFormat->nSamplesPerSec;
	fapo->inBlockAlign = pInputLockedParameters->pFormat->nBlockAlign;
	fapo->outBlockAlign = pOutputLockedParameters->pFormat->nBlockAlign;

	/* Create the network */
	DspReverb_Create(
		&fapo->reverb,
		fapo->sampleRate,
		fapo->inChannels,
		fapo->outChannels,
		fapo->base.pMalloc
	);

	/* Call	parent to do basic validation */
	return FAPOBase_LockForProcess(
		&fapo->base,
		InputLockedParameterCount,
		pInputLockedParameters,
		OutputLockedParameterCount,
		pOutputLockedParameters
	);
}